

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

int lua_type(lua_State *L,int idx)

{
  TValue *pTVar1;
  int tt;
  uint32_t t;
  cTValue *o;
  int idx_local;
  lua_State *L_local;
  
  pTVar1 = index2adr(L,idx);
  if ((uint)((int)(pTVar1->field_4).it >> 0xf) < 0xfffffff3) {
    L_local._4_4_ = 3;
  }
  else if (pTVar1 == (TValue *)((L->glref).ptr64 + 0xf8)) {
    L_local._4_4_ = 0xffffffff;
  }
  else {
    L_local._4_4_ =
         (uint)(0x75a0698042110 >>
               ((byte)(((int)(pTVar1->field_4).it >> 0xf ^ 0xffffffffU) << 2) & 0x3f)) & 0xf;
  }
  return L_local._4_4_;
}

Assistant:

LUA_API int lua_type(lua_State *L, int idx)
{
  cTValue *o = index2adr(L, idx);
  if (tvisnumber(o)) {
    return LUA_TNUMBER;
#if LJ_64 && !LJ_GC64
  } else if (tvislightud(o)) {
    return LUA_TLIGHTUSERDATA;
#endif
  } else if (o == niltv(L)) {
    return LUA_TNONE;
  } else {  /* Magic internal/external tag conversion. ORDER LJ_T */
    uint32_t t = ~itype(o);
#if LJ_64
    int tt = (int)((U64x(75a06,98042110) >> 4*t) & 15u);
#else
    int tt = (int)(((t < 8 ? 0x98042110u : 0x75a06u) >> 4*(t&7)) & 15u);
#endif
    lj_assertL(tt != LUA_TNIL || tvisnil(o), "bad tag conversion");
    return tt;
  }
}